

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

bool google::protobuf::compiler::js::anon_unknown_0::IsPrimitive(string *type)

{
  bool bVar1;
  
  bVar1 = std::operator==(type,"undefined");
  if (!bVar1) {
    bVar1 = std::operator==(type,"string");
    if (!bVar1) {
      bVar1 = std::operator==(type,"number");
      if (!bVar1) {
        bVar1 = std::operator==(type,"boolean");
        return bVar1;
      }
    }
  }
  return true;
}

Assistant:

bool IsPrimitive(const std::string& type) {
  return type == "undefined" || type == "string" || type == "number" ||
         type == "boolean";
}